

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

ssize_t anon_unknown.dwarf_347e::ReadPersistent(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t len;
  ssize_t num_bytes;
  char *buf0;
  size_t count_local;
  void *buf_local;
  int fd_local;
  
  if (fd < 0) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
            ,0x45,"fd",">=","0");
    abort();
  }
  for (len = 0; (ulong)len < count; len = sVar1 + len) {
    do {
      sVar1 = read(fd,(void *)((long)buf + len),count - len);
      bVar3 = false;
      if (sVar1 < 0) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (sVar1 < 0) {
      return -1;
    }
    if (sVar1 == 0) break;
  }
  if ((ulong)len <= count) {
    return len;
  }
  syscall(1,2,"Check failed: num_bytes <= count\n",0x21);
  abort();
}

Assistant:

static ssize_t ReadPersistent(const int fd, void *buf, const size_t count) {
  CHECK_GE(fd, 0);
  char *buf0 = reinterpret_cast<char *>(buf);
  ssize_t num_bytes = 0;
  while (num_bytes < count) {
    ssize_t len;
    NO_INTR(len = read(fd, buf0 + num_bytes, count - num_bytes));
    if (len < 0) {  // There was an error other than EINTR.
      return -1;
    }
    if (len == 0) {  // Reached EOF.
      break;
    }
    num_bytes += len;
  }
  CHECK(num_bytes <= count);
  return num_bytes;
}